

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgnxk(fitsfile *fptr,char **inclist,int ninc,char **exclist,int nexc,char *card,int *status)

{
  int iVar1;
  char *in_RCX;
  int in_EDX;
  int in_R8D;
  int *in_R9;
  char keyname [75];
  char keybuf [81];
  long jj;
  long ii;
  int namelen;
  int exact;
  int match;
  int casesn;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char local_b8 [96];
  long local_58;
  long local_50;
  int in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  *(undefined1 *)in_R9 = 0;
  if (*(int *)keyname._8_8_ < 1) {
    uVar2 = 0;
    while (iVar1 = ffgcrd((fitsfile *)keyname._40_8_,(char *)keyname._32_8_,(char *)keyname._24_8_,
                          (int *)keyname._16_8_), iVar1 < 1) {
      ffgknm(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
      for (local_50 = 0; local_50 < in_EDX; local_50 = local_50 + 1) {
        ffcmps((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8D,in_R9,
               (int *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
        if (in_stack_ffffffffffffffc0 != 0) {
          local_58 = -1;
          do {
            local_58 = local_58 + 1;
            if (in_R8D <= local_58) break;
            ffcmps((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8D,in_R9,
                   (int *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
          } while (in_stack_ffffffffffffffc0 == 0);
          if (in_R8D <= local_58) {
            strcat((char *)in_R9,local_b8);
            return *(int *)keyname._8_8_;
          }
        }
      }
    }
    local_4 = *(int *)keyname._8_8_;
  }
  else {
    local_4 = *(int *)keyname._8_8_;
  }
  return local_4;
}

Assistant:

int ffgnxk( fitsfile *fptr,     /* I - FITS file pointer              */
            char **inclist,     /* I - list of included keyword names */
            int ninc,           /* I - number of names in inclist     */
            char **exclist,     /* I - list of excluded keyword names */
            int nexc,           /* I - number of names in exclist     */
            char *card,         /* O - first matching keyword         */
            int  *status)       /* IO - error status                  */
/*
    Return the next keyword that matches one of the names in inclist
    but does not match any of the names in exclist.  The search
    goes from the current position to the end of the header, only.
    Wild card characters may be used in the name lists ('*', '?' and '#').
*/
{
    int casesn, match, exact, namelen;
    long ii, jj;
    char keybuf[FLEN_CARD], keyname[FLEN_KEYWORD];

    card[0] = '\0';
    if (*status > 0)
        return(*status);

    casesn = FALSE;

    /* get next card, and return with an error if hit end of header */
    while( ffgcrd(fptr, "*", keybuf, status) <= 0)
    {
        ffgknm(keybuf, keyname, &namelen, status); /* get the keyword name */
        
        /* does keyword match any names in the include list? */
        for (ii = 0; ii < ninc; ii++)
        {
            ffcmps(inclist[ii], keyname, casesn, &match, &exact);
            if (match)
            {
                /* does keyword match any names in the exclusion list? */
                jj = -1;
                while ( ++jj < nexc )
                {
                    ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                    if (match)
                        break;
                }

                if (jj >= nexc)
                {
                    /* not in exclusion list, so return this keyword */
                    strcat(card, keybuf);
                    return(*status);
                }
            }
        }
    }
    return(*status);
}